

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::java::Context::~Context(Context *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->options_).output_list_file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->options_).output_list_file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->options_).annotation_list_file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->options_).annotation_list_file.field_2) {
    operator_delete(pcVar1);
  }
  std::
  _Rb_tree<const_google::protobuf::OneofDescriptor_*,_std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>,_std::_Select1st<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
  ::~_Rb_tree(&(this->oneof_generator_info_map_)._M_t);
  std::
  _Rb_tree<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>,_std::_Select1st<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
  ::~_Rb_tree(&(this->field_generator_info_map_)._M_t);
  std::
  unique_ptr<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
  ::~unique_ptr(&this->name_resolver_);
  return;
}

Assistant:

Context::~Context() {}